

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

size_t __thiscall sentencepiece::SelfTestData::ByteSizeLong(SelfTestData *this)

{
  Rep *pRVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  
  sVar3 = google::protobuf::internal::ExtensionSet::ByteSize(&this->_extensions_);
  lVar7 = (long)(this->samples_).super_RepeatedPtrFieldBase.current_size_;
  sVar3 = sVar3 + lVar7;
  pRVar1 = (this->samples_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar6 = 0; lVar7 * 8 != lVar6; lVar6 = lVar6 + 8) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<sentencepiece::SelfTestData_Sample>
                      (*(SelfTestData_Sample **)((long)ppvVar5 + lVar6));
    sVar3 = sVar3 + sVar4;
  }
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    sVar3 = sVar3 + *(long *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict1)sVar3;
  return sVar3;
}

Assistant:

size_t SelfTestData::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.SelfTestData)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .sentencepiece.SelfTestData.Sample samples = 1;
  total_size += 1UL * this->_internal_samples_size();
  for (const auto& msg : this->samples_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}